

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt.cpp
# Opt level: O3

uint crnlib::dxt1_block::get_block_colors4_round(color_quad_u8 *pDst,uint16 color0,uint16 color1)

{
  int iVar1;
  int iVar2;
  ushort uVar3;
  uint uVar4;
  undefined6 in_register_00000012;
  ulong uVar5;
  undefined6 in_register_00000032;
  ulong uVar6;
  ushort uVar7;
  uint uVar8;
  
  uVar6 = CONCAT62(in_register_00000032,color0);
  uVar5 = CONCAT62(in_register_00000012,color1);
  uVar3 = (short)(uVar6 >> 0xb) << 3 | color0 >> 0xd;
  iVar1 = (((uint)uVar6 & 0x1c) >> 2) + ((uint)uVar6 & 0x1f) * 8;
  uVar4 = (uint)(uVar6 >> 9) & 3 | (uint)(uVar6 >> 3) & 0xfc;
  uVar7 = (short)(uVar5 >> 0xb) << 3 | color1 >> 0xd;
  iVar2 = (((uint)uVar5 & 0x1c) >> 2) + ((uint)uVar5 & 0x1f) * 8;
  uVar8 = (uint)(uVar5 >> 9) & 3 | (uint)(uVar5 >> 3) & 0xfc;
  (pDst->field_0).field_0.r = (uchar)uVar3;
  (pDst->field_0).field_0.g = (uchar)uVar4;
  (pDst->field_0).field_0.b = (uchar)iVar1;
  (pDst->field_0).field_0.a = 0xff;
  pDst[1].field_0.field_0.r = (uchar)uVar7;
  pDst[1].field_0.field_0.g = (uchar)uVar8;
  pDst[1].field_0.field_0.b = (uchar)iVar2;
  pDst[1].field_0.field_0.a = 0xff;
  pDst[2].field_0.field_0.r = (uchar)(((uint)uVar7 + (uint)uVar3 * 2 + 1 & 0xffff) * 0x5556 >> 0x10)
  ;
  pDst[2].field_0.field_0.g = (uchar)((uVar8 + uVar4 * 2 + 1) / 3);
  pDst[2].field_0.field_0.b = (uchar)((uint)((iVar2 + iVar1 * 2 + 1) * 0x5556) >> 0x10);
  pDst[2].field_0.field_0.a = 0xff;
  pDst[3].field_0.field_0.r = (uchar)(((uint)uVar3 + (uint)uVar7 * 2 + 1 & 0xffff) * 0x5556 >> 0x10)
  ;
  pDst[3].field_0.field_0.g = (uchar)((uVar4 + uVar8 * 2 + 1) / 3);
  pDst[3].field_0.field_0.b = (uchar)((uint)((iVar1 + iVar2 * 2 + 1) * 0x5556) >> 0x10);
  pDst[3].field_0.field_0.a = 0xff;
  return 4;
}

Assistant:

color_quad_u8 dxt1_block::unpack_color(uint16 packed_color, bool scaled, uint alpha)
    {
        uint b = packed_color & 31U;
        uint g = (packed_color >> 5U) & 63U;
        uint r = (packed_color >> 11U) & 31U;

        if (scaled)
        {
            b = (b << 3U) | (b >> 2U);
            g = (g << 2U) | (g >> 4U);
            r = (r << 3U) | (r >> 2U);
        }

        return color_quad_u8(cNoClamp, r, g, b, math::minimum(alpha, 255U));
    }